

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__get16be(stbi__context *s)

{
  byte bVar1;
  byte bVar2;
  int z;
  stbi__context *s_local;
  
  bVar1 = stbi__get8(s);
  bVar2 = stbi__get8(s);
  return (uint)bVar1 * 0x100 + (uint)bVar2;
}

Assistant:

static int stbi__get16be(stbi__context* s)
{
    int z = stbi__get8(s);
    return (z << 8) + stbi__get8(s);
}